

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConeShape.cpp
# Opt level: O2

void __thiscall cbtConeShapeZ::cbtConeShapeZ(cbtConeShapeZ *this,cbtScalar radius,cbtScalar height)

{
  cbtConeShape::cbtConeShape(&this->super_cbtConeShape,radius,height);
  (this->super_cbtConeShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtConvexShape_01195da0;
  cbtConeShape::setConeUpIndex(&this->super_cbtConeShape,2);
  return;
}

Assistant:

cbtConeShapeZ::cbtConeShapeZ(cbtScalar radius, cbtScalar height) : cbtConeShape(radius, height)
{
	setConeUpIndex(2);
}